

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

SolveStatus
cptp_solve(Instance *instance,char *solver_name,SolverParams *params,Solution *solution,
          double timelimit,int32_t randomseed)

{
  SolveStatus SVar1;
  _Bool _Var2;
  int iVar3;
  SolveStatus SVar4;
  time_t tVar5;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  int64_t iVar6;
  long in_FS_OFFSET;
  SolverTypedParams tparams;
  Solver solver;
  SolverTypedParams local_60;
  Solver local_58;
  
  iVar3 = strcmp(solver_name,"stub");
  if (iVar3 == 0) {
    log_log(0x20,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x1bf,"%s :: Found descriptor for solver `%s`","cptp_solve",solver_name);
    if (randomseed == 0) {
      tVar5 = time((time_t *)0x0);
      randomseed = (int)tVar5 +
                   ((int)(SUB168(SEXT816(tVar5) * ZEXT816(0x8000000100000003),8) >> 0x1e) -
                   (SUB164(SEXT816(tVar5) * ZEXT816(0x8000000100000003),0xc) >> 0x1f)) * -0x7fffffff
      ;
    }
    printf("%s :: Setting seed = %d\n","cptp_solve",(ulong)(uint)randomseed);
    srand(randomseed);
    printf("%s :: Setting timelimit = %f\n",timelimit,"cptp_solve");
    if (0x100 < params->num_params) {
      __assert_fail("params->num_params <= MAX_NUM_SOLVER_PARAMS",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                    ,0xf2,
                    "_Bool verify_solver_params(const SolverDescriptor *, const SolverParams *)");
    }
    if (params->num_params < 1) {
      local_60.entries = (SolverTypedParamsEntry *)0x0;
      _Var2 = resolve_params(params,&STUB_SOLVER_DESCRIPTOR,&local_60);
      if (_Var2) {
        stub_solver_create(&local_58,instance,&local_60,timelimit,randomseed);
        local_58.sigterm_occured = false;
        local_58.sigterm_occured_int = 0;
        *(Solver **)(in_FS_OFFSET + -8) = &local_58;
        __handler = signal(0xf,cptp_sighandler);
        __handler_00 = signal(2,cptp_sighandler);
        iVar6 = os_get_nanosecs();
        SVar4 = (*local_58.solve)(&local_58,instance,solution,iVar6 / 1000);
        signal(0xf,__handler);
        signal(2,__handler_00);
        *(undefined8 *)(in_FS_OFFSET + -8) = 0;
        SVar1 = SVar4 | SOLVE_STATUS_ABORTION_SIGTERM;
        if (local_58.sigterm_occured == false) {
          SVar1 = SVar4;
        }
        (*local_58.destroy)(&local_58);
        log_log(0x20,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                ,0x17b,"Solver `%s` returned with solve status: %x",solver_name,(ulong)SVar1);
        if ((SVar1 & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL) == SOLVE_STATUS_NULL) {
          if (((SVar1 & SOLVE_STATUS_CLOSED_PROBLEM) != SOLVE_STATUS_NULL) &&
             (-1000.0 <=
              (solution->primal_bound - solution->dual_bound) /
              (ABS(solution->primal_bound) + 1e-10))) {
            __assert_fail("gap < -1000.0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                          ,0x194,
                          "void postprocess_solver_solution(const Instance *, SolveStatus, Solution *)"
                         );
          }
        }
        else {
          validate_primal_solution(instance,solution,1);
          if (((SVar1 & SOLVE_STATUS_CLOSED_PROBLEM) != SOLVE_STATUS_NULL) &&
             (0.06 < ABS((solution->primal_bound - solution->dual_bound) /
                         (ABS(solution->primal_bound) + 1e-10)))) {
            __assert_fail("feq(gap, 0.0, SIX_PERCENT)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                          ,0x18d,
                          "void postprocess_solver_solution(const Instance *, SolveStatus, Solution *)"
                         );
          }
        }
        if (SVar1 == SOLVE_STATUS_NULL || (SVar1 & SOLVE_STATUS_ERR) != SOLVE_STATUS_NULL) {
          solution->primal_bound = 0.0;
          solution->dual_bound = INFINITY;
          tour_clear(&solution->tour);
        }
        if (local_60.entries == (SolverTypedParamsEntry *)0x0) {
          return SVar1;
        }
        stbds_hmfree_func(local_60.entries + -1,0x18);
        return SVar1;
      }
      cptp_solve_cold_1();
    }
    else {
      cptp_solve_cold_2();
    }
  }
  else {
    log_log(0x80,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x1bb,"%s :: `%s` is not a know solver","cptp_solve",solver_name);
  }
  solution->primal_bound = 0.0;
  solution->dual_bound = INFINITY;
  tour_clear(&solution->tour);
  return SOLVE_STATUS_NULL;
}

Assistant:

SolveStatus cptp_solve(const Instance *instance, const char *solver_name,
                       const SolverParams *params, Solution *solution,
                       double timelimit, int32_t randomseed) {
    SolveStatus status = SOLVE_STATUS_NULL;
    const SolverLookup *lookup = lookup_solver(solver_name);

    if (lookup == NULL) {
        log_fatal("%s :: `%s` is not a know solver", __func__, solver_name);
        goto fail;
    } else {
        log_info("%s :: Found descriptor for solver `%s`", __func__,
                 solver_name);
    }

    if (randomseed == 0) {
        randomseed = (int32_t)(time(NULL) % INT32_MAX);
    }

    printf("%s :: Setting seed = %d\n", __func__, randomseed);
    srand(randomseed);

    printf("%s :: Setting timelimit = %f\n", __func__, timelimit);

    if (!verify_solver_params(lookup->descriptor, params)) {
        fprintf(stderr, "ERROR: %s :: Failed to verify params\n", __func__);
        goto fail;
    }

    SolverTypedParams tparams = {0};

    if (!resolve_params(params, lookup->descriptor, &tparams)) {
        fprintf(stderr, "ERROR: %s :: Failed to resolve parameters\n",
                __func__);
        goto fail;
    }

    Solver solver =
        lookup->create_fn(instance, &tparams, timelimit, randomseed);

    {
        solver.sigterm_occured = false;
        solver.sigterm_occured_int = 0;

        // Setup signals
        sighandler_ctx_solver_ptr = &solver;
        sighandler_t prev_sigterm_handler = signal(SIGTERM, cptp_sighandler);
        sighandler_t prev_sigint_handler = signal(SIGINT, cptp_sighandler);
        {
            int64_t begin_time = os_get_usecs();
            status = solver.solve(&solver, instance, solution, begin_time);
        }
        // Resets the signals
        signal(SIGTERM, prev_sigterm_handler);
        signal(SIGINT, prev_sigint_handler);
        sighandler_ctx_solver_ptr = NULL;
    }

    if (solver.sigterm_occured) {
        status |= SOLVE_STATUS_ABORTION_SIGTERM;
    }

    solver.destroy(&solver);
    log_solve_status(status, solver_name);
    postprocess_solver_solution(instance, status, solution);
    solver_typed_params_destroy(&tparams);
    return status;

fail:
    solution_clear(solution);
    return status;
}